

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Performance::getNameSpecialization_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,deUint32 id)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  size_type *psVar4;
  undefined1 auStack_1b8 [8];
  string *local_1b0 [2];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined8 auStack_180 [12];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 0x10));
  lVar1 = *(long *)(local_190._M_allocated_capacity - 0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    std::ios::widen((char)auStack_1b8 + (char)lVar1 + '(');
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  *(undefined8 *)((long)auStack_180 + *(long *)(local_190._M_allocated_capacity - 0x18)) = 10;
  std::ostream::_M_insert<unsigned_long>((ulong)(local_1a0 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 0x10));
  std::ios_base::~ios_base(local_120);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x1c5159d);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  psVar3 = (string *)local_1a0;
  if (local_1b0[0] != psVar3) {
    operator_delete(local_1b0[0],(ulong)(local_1a0._0_8_ + 1));
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static string getNameSpecialization (deUint32 id)
{
	return "_" + toStringWithPadding(id, 10);
}